

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O0

void __thiscall AST::ASTBuilder::constructListAndInsertAsChild(ASTBuilder *this)

{
  __type _Var1;
  reference ppAVar2;
  string *__lhs;
  string *__rhs;
  ASTNode *this_00;
  ASTNode *local_78;
  undefined1 local_6a;
  allocator local_69;
  string local_68;
  ASTNode *local_48;
  Calls *A;
  undefined1 local_30 [8];
  vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> childrenToBeInserted;
  value_type B;
  ASTBuilder *this_local;
  
  ppAVar2 = std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>
            ::top(&this->stack);
  childrenToBeInserted.super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*ppAVar2;
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::pop
            (&this->stack);
  std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::vector
            ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)local_30);
  std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back
            ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)local_30,
             (value_type *)
             &childrenToBeInserted.
              super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    ppAVar2 = std::
              stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::
              top(&this->stack);
    __lhs = ASTNode::getName_abi_cxx11_(*ppAVar2);
    __rhs = ASTNode::getName_abi_cxx11_
                      ((ASTNode *)
                       childrenToBeInserted.
                       super__Vector_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    _Var1 = std::operator==(__lhs,__rhs);
    if (!_Var1) break;
    ppAVar2 = std::
              stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::
              top(&this->stack);
    std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back
              ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)local_30,ppAVar2);
    std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::pop
              (&this->stack);
  }
  this_00 = (ASTNode *)operator_new(200);
  local_6a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"calls",&local_69);
  Calls::Calls((Calls *)this_00,&local_68,(Token *)0x0);
  local_6a = 0;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_48 = this_00;
  ASTNode::addChildToLeft
            (this_00,(vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)local_30);
  local_78 = local_48;
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::push
            (&this->stack,&local_78);
  std::vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::~vector
            ((vector<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *)local_30);
  return;
}

Assistant:

void AST::ASTBuilder::constructListAndInsertAsChild() {
    auto B = stack.top();
    stack.pop();
    std::vector<ASTNode *> childrenToBeInserted;
    childrenToBeInserted.push_back(B);
    while (stack.top()->getName() == B->getName()) {
        childrenToBeInserted.push_back(stack.top());
        stack.pop();
    }

    auto A = new Calls("calls", nullptr);
    A->addChildToLeft(childrenToBeInserted);
    stack.push(A);
}